

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thief.c
# Opt level: O2

void do_ghetto_bind(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  CHAR_DATA *ch_00;
  char *txt;
  int iVar5;
  AFFECT_DATA af;
  char arg [4608];
  
  one_argument(argument,arg);
  bVar1 = is_npc(ch);
  if (!bVar1) {
    iVar2 = get_skill(ch,(int)gsn_bind);
    if (iVar2 == 0) {
      txt = "Huh?\n\r";
    }
    else if (arg[0] == '\0') {
      txt = "Attempt to bind who?\n\r";
    }
    else {
      ch_00 = get_char_room(ch,arg);
      if (ch_00 == (CHAR_DATA *)0x0) {
        txt = "They aren\'t here.\n\r";
      }
      else if (ch_00 == ch) {
        txt = "You can\'t do that.\n\r";
      }
      else if (ch_00->position == 4) {
        bVar1 = is_affected(ch_00,(int)gsn_bind);
        if (!bVar1) {
          bVar1 = is_affected(ch_00,0x15);
          iVar5 = iVar2 + -0x1e;
          if (!bVar1) {
            iVar5 = iVar2;
          }
          bVar1 = is_affected(ch,0x15);
          iVar2 = iVar5 + 0x1e;
          if (!bVar1) {
            iVar2 = iVar5;
          }
          iVar3 = get_curr_stat(ch_00,3);
          iVar4 = get_curr_stat(ch,3);
          iVar5 = iVar2 + -0x14;
          if (iVar3 <= iVar4) {
            iVar5 = iVar2;
          }
          iVar2 = number_percent();
          if (iVar5 <= iVar2) {
            init_affect(&af);
            af.where = 0;
            af.aftype = 5;
            af.type = gsn_bind;
            af.level = ch->level;
            af.duration = 3;
            af.location = 0;
            af.modifier = 0;
            affect_to_char(ch_00,&af);
            act("$n tries to put a sack over $N\'s head but it rips.",ch,(void *)0x0,ch_00,1);
            send_to_char("You feel someone trying to put something over your head and legs.\n\r",
                         ch_00);
            iVar3 = 3;
            act("You try to put a sack over $N\'s head but it rips.",ch,(void *)0x0,ch_00,3);
            WAIT_STATE(ch,0x24);
          }
          else {
            af.aftype = 1;
            init_affect(&af);
            af.where = 0;
            af.type = gsn_bind;
            af.level = ch->level;
            af.duration = -1;
            af.bitvector[0]._0_1_ = (byte)af.bitvector[0] | 1;
            af.location = 2;
            af.modifier = -5;
            affect_to_char(ch_00,&af);
            iVar3 = 1;
            act("$n puts a sack over $N\'s head and ties a rope around $S legs tightly.",ch,
                (void *)0x0,ch_00,1);
            act("You feel someone putting something over your head and legs.",ch,(void *)0x0,ch_00,2
               );
            act("You put a sack over $N\'s head and tie a rope around $S legs tightly.",ch,
                (void *)0x0,ch_00,3);
            WAIT_STATE(ch,0xc);
          }
          check_improve(ch,(int)gsn_bind,iVar5 > iVar2,iVar3);
          return;
        }
        txt = "They are already bound.\n\r";
      }
      else {
        txt = "They must be sleeping for you to bind them.\n\r";
      }
    }
    send_to_char(txt,ch);
  }
  return;
}

Assistant:

void do_ghetto_bind(CHAR_DATA *ch, char *argument)
{
	CHAR_DATA *victim;
	int chance;
	AFFECT_DATA af;
	char arg[MAX_INPUT_LENGTH];

	one_argument(argument, arg);

	if (is_npc(ch))
		return;

	chance = get_skill(ch, gsn_bind);

	if (chance == 0)
	{
		send_to_char("Huh?\n\r", ch);
		return;
	}

	if (arg[0] == '\0')
	{
		send_to_char("Attempt to bind who?\n\r", ch);
		return;
	}

	victim = get_char_room(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (victim == ch)
	{
		send_to_char("You can't do that.\n\r", ch);
		return;
	}

	if (victim->position != POS_SLEEPING)
	{
		send_to_char("They must be sleeping for you to bind them.\n\r", ch);
		return;
	}

	if (is_affected(victim, gsn_bind))
	{
		send_to_char("They are already bound.\n\r", ch);
		return;
	}

	if (is_affected(victim, AFF_HASTE))
		chance -= 30;

	if (is_affected(ch, AFF_HASTE))
		chance += 30;

	if (get_curr_stat(victim, STAT_DEX) > get_curr_stat(ch, STAT_DEX))
		chance -= 20;

	if (number_percent() < chance)
	{
		af.aftype = AFT_SKILL;

		init_affect(&af);
		af.where = TO_AFFECTS;
		af.type = gsn_bind;
		af.level = ch->level;
		af.duration = -1;

		SET_BIT(af.bitvector, AFF_BLIND);
		af.modifier = -5;
		af.location = APPLY_DEX;
		affect_to_char(victim, &af);

		act("$n puts a sack over $N's head and ties a rope around $S legs tightly.", ch, 0, victim, TO_NOTVICT);
		act("You feel someone putting something over your head and legs.", ch, 0, victim, TO_VICT);
		act("You put a sack over $N's head and tie a rope around $S legs tightly.", ch, 0, victim, TO_CHAR);

		WAIT_STATE(ch, PULSE_VIOLENCE);
		check_improve(ch, gsn_bind, true, 1);
	}
	else
	{
		init_affect(&af);
		af.where = TO_AFFECTS;
		af.aftype = AFT_INVIS;
		af.type = gsn_bind;
		af.level = ch->level;
		af.duration = 3;
		af.modifier = 0;
		af.location = APPLY_NONE;
		affect_to_char(victim, &af);

		act("$n tries to put a sack over $N's head but it rips.", ch, 0, victim, TO_NOTVICT);
		send_to_char("You feel someone trying to put something over your head and legs.\n\r", victim);

		act("You try to put a sack over $N's head but it rips.", ch, 0, victim, TO_CHAR);

		WAIT_STATE(ch, PULSE_VIOLENCE * 3);
		check_improve(ch, gsn_bind, false, 3);
	}
}